

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

void image_manipulation::resize_and_pad_image
               (clip_image_u8 *image,clip_image_u8 *dst,clip_image_size *target_resolution,
               array<unsigned_char,_3UL> pad_color)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint target_height;
  int iVar3;
  int iVar4;
  int iVar5;
  int target_width;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int c;
  long lVar11;
  ulong uVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  clip_image_u8 resized_image;
  undefined1 local_90 [16];
  pointer local_80;
  undefined8 local_78;
  int iStack_70;
  int iStack_6c;
  undefined1 local_68 [24];
  pointer local_50;
  clip_image_size local_48;
  undefined8 uStack_40;
  
  local_48 = *target_resolution;
  iVar16 = local_48.width;
  iStack_70 = local_48.height;
  auVar14._0_4_ = (float)iVar16;
  auVar14._4_4_ = (float)iStack_70;
  auVar14._8_8_ = 0;
  uVar1 = image->nx;
  uVar2 = image->ny;
  auVar15._4_4_ = (float)(int)uVar2;
  auVar15._0_4_ = (float)(int)uVar1;
  auVar15._8_8_ = 0;
  auVar15 = divps(auVar14,auVar15);
  uVar6 = (ulong)local_48 & 0xffffffff;
  uStack_40 = 0;
  local_78 = (clip_image_u8 *)CONCAT44(iStack_70,iStack_70);
  iStack_6c = iStack_70;
  if (auVar15._4_4_ <= auVar15._0_4_) {
    fVar13 = ceilf(auVar15._4_4_ * (float)(int)uVar1);
    uVar7 = (ulong)(uint)(int)fVar13;
    if (iVar16 < (int)fVar13) {
      uVar7 = uVar6;
    }
    uVar6 = uVar7;
    target_height = (uint)local_78;
  }
  else {
    fVar13 = ceilf(auVar15._0_4_ * (float)(int)uVar2);
    target_height = (int)fVar13;
    if ((int)(uint)local_78 < (int)fVar13) {
      target_height = (uint)local_78;
    }
  }
  local_68._8_16_ = (undefined1  [16])0x0;
  local_50 = (pointer)0x0;
  target_width = (int)uVar6;
  bicubic_resize(image,(clip_image_u8 *)local_68,target_width,target_height);
  local_90 = (undefined1  [16])0x0;
  local_80 = (pointer)0x0;
  iVar4 = local_48.width;
  iVar3 = (uint)local_78;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,
             (long)(int)(iVar16 * (uint)local_78 * 3));
  if (local_90._8_8_ != local_90._0_8_) {
    uVar7 = 0;
    do {
      *(uchar *)(local_90._0_8_ + uVar7) = pad_color._M_elems[0];
      *(uchar *)(local_90._0_8_ + uVar7 + 1) = pad_color._M_elems[1];
      *(uchar *)(local_90._0_8_ + uVar7 + 2) = pad_color._M_elems[2];
      uVar7 = uVar7 + 3;
    } while (uVar7 < (ulong)(local_90._8_8_ - local_90._0_8_));
  }
  if (0 < (int)target_height) {
    iVar5 = (((int)(iVar3 - target_height) / 2) * iVar16 + (iVar16 - target_width) / 2) * 3;
    lVar8 = 0;
    uVar7 = 0;
    do {
      if (0 < target_width) {
        uVar12 = 0;
        lVar9 = lVar8;
        iVar10 = iVar5;
        do {
          lVar11 = 0;
          do {
            *(uchar *)(local_90._0_8_ + lVar11 + iVar10) =
                 *(pointer)(local_68._8_8_ + lVar11 + lVar9);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          uVar12 = uVar12 + 1;
          iVar10 = iVar10 + 3;
          lVar9 = lVar9 + 3;
        } while (uVar12 != uVar6);
      }
      uVar7 = uVar7 + 1;
      iVar5 = iVar5 + iVar16 * 3;
      lVar8 = lVar8 + (long)target_width * 3;
    } while (uVar7 != target_height);
  }
  dst->nx = iVar4;
  dst->ny = iVar3;
  local_78 = dst;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&dst->buf,local_90);
  if ((pointer)local_90._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_90._0_8_,(long)local_80 - local_90._0_8_);
  }
  if ((pointer)local_68._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._8_8_,(long)local_50 - local_68._8_8_);
  }
  return;
}

Assistant:

static void resize_and_pad_image(const clip_image_u8 & image, clip_image_u8 & dst, const clip_image_size & target_resolution, std::array<uint8_t, 3> pad_color = {0, 0, 0}) {
        int target_width  = target_resolution.width;
        int target_height = target_resolution.height;

        float scale_w = static_cast<float>(target_width) / image.nx;
        float scale_h = static_cast<float>(target_height) / image.ny;

        int new_width, new_height;

        if (scale_w < scale_h) {
            new_width  = target_width;
            new_height = std::min(static_cast<int>(std::ceil(image.ny * scale_w)), target_height);
        } else {
            new_height = target_height;
            new_width  = std::min(static_cast<int>(std::ceil(image.nx * scale_h)), target_width);
        }

        clip_image_u8 resized_image;
        bicubic_resize(image, resized_image, new_width, new_height);

        clip_image_u8 padded_image;
        padded_image.nx = target_width;
        padded_image.ny = target_height;
        padded_image.buf.resize(3 * target_width * target_height);

        // Fill the padded image with the fill color
        for (size_t i = 0; i < padded_image.buf.size(); i += 3) {
            padded_image.buf[i]     = pad_color[0];
            padded_image.buf[i + 1] = pad_color[1];
            padded_image.buf[i + 2] = pad_color[2];
        }

        // Calculate padding offsets
        int pad_x = (target_width  - new_width)  / 2;
        int pad_y = (target_height - new_height) / 2;

        // Copy the resized image into the center of the padded buffer
        for (int y = 0; y < new_height; ++y) {
            for (int x = 0; x < new_width; ++x) {
                for (int c = 0; c < 3; ++c) {
                    padded_image.buf[3 * ((y + pad_y) * target_width + (x + pad_x)) + c] = resized_image.buf[3 * (y * new_width + x) + c];
                }
            }
        }
        dst = std::move(padded_image);
    }